

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QString * __thiscall
QFileDialogPrivate::getEnvironmentVariable(QFileDialogPrivate *this,QString *string)

{
  qsizetype qVar1;
  ulong uVar2;
  QStringView *in_RDX;
  QStringView *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView *in_stack_ffffffffffffff88;
  QStringView *str;
  QStringView *this_00;
  QStringView *n;
  qsizetype in_stack_ffffffffffffffb8;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = in_RDI;
  n = in_RDI;
  qVar1 = QString::size((QString *)in_RDX);
  if (1 < qVar1) {
    this_00 = in_RDX;
    QChar::QChar<char16_t,_true>(&local_a,L'$');
    uVar2 = QString::startsWith((QChar *)in_RDX,(uint)(ushort)local_a.ucs);
    in_stack_ffffffffffffff88 = in_RDX;
    if ((uVar2 & 1) != 0) {
      QStringView::QStringView<QString,_true>(this_00,(QString *)str);
      QStringView::mid(in_RSI,in_stack_ffffffffffffffb8,(qsizetype)n);
      QStringView::toLatin1(in_RDI);
      QByteArray::constData((QByteArray *)0x75c9ef);
      qEnvironmentVariable((char *)in_RDI);
      QByteArray::~QByteArray((QByteArray *)0x75ca06);
      goto LAB_0075ca17;
    }
  }
  QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffff88);
LAB_0075ca17:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)str;
}

Assistant:

QString QFileDialogPrivate::getEnvironmentVariable(const QString &string)
{
#ifdef Q_OS_UNIX
    if (string.size() > 1 && string.startsWith(u'$')) {
        return qEnvironmentVariable(QStringView{string}.mid(1).toLatin1().constData());
    }
#else
    if (string.size() > 2 && string.startsWith(u'%') && string.endsWith(u'%')) {
        return qEnvironmentVariable(QStringView{string}.mid(1, string.size() - 2).toLatin1().constData());
    }
#endif
    return string;
}